

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmyblas2.c
# Opt level: O1

void cusolve(int ldm,int ncol,singlecomplex *M,singlecomplex *rhs)

{
  float fVar1;
  float fVar2;
  singlecomplex sVar3;
  ulong uVar4;
  float *pfVar5;
  undefined4 in_register_00000034;
  int iVar6;
  singlecomplex xj;
  singlecomplex local_58;
  undefined8 local_50;
  singlecomplex *local_48;
  long local_40;
  ulong local_38;
  
  local_50 = CONCAT44(in_register_00000034,ncol);
  if (0 < ncol) {
    pfVar5 = &M[((ulong)(uint)ncol - 1) * (long)ldm].i;
    local_40 = (long)ldm * -8;
    iVar6 = 0;
    uVar4 = (ulong)(uint)ncol;
    local_48 = M;
    do {
      ncol = ncol - 1;
      local_38 = uVar4 - 1;
      c_div(&local_58,rhs + (uVar4 - 1),local_48 + uVar4 + (long)((int)local_38 * ldm) + -1);
      sVar3.i = local_58.i;
      sVar3.r = local_58.r;
      rhs[uVar4 - 1] = sVar3;
      if (1 < (long)uVar4) {
        uVar4 = 0;
        do {
          fVar1 = pfVar5[uVar4 * 2 + -1];
          fVar2 = pfVar5[uVar4 * 2];
          rhs[uVar4].r = rhs[uVar4].r - (local_58.r * fVar1 + fVar2 * -local_58.i);
          rhs[uVar4].i = rhs[uVar4].i - (fVar1 * local_58.i + fVar2 * local_58.r);
          uVar4 = uVar4 + 1;
        } while ((uint)ncol != uVar4);
      }
      iVar6 = iVar6 + 1;
      pfVar5 = (float *)((long)pfVar5 + local_40);
      uVar4 = local_38;
    } while (iVar6 != (int)local_50);
  }
  return;
}

Assistant:

void cusolve (int ldm, int ncol, singlecomplex *M, singlecomplex *rhs)
{
    singlecomplex xj, temp;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	c_div(&xj, &rhs[jcol], &M[jcol + jcol*ldm]); /* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++) {
	    cc_mult(&temp, &xj, &M[irow+jcol*ldm]); /* M(irow, jcol) */
	    c_sub(&rhs[irow], &rhs[irow], &temp);
	}

	jcol--;

    }
}